

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O0

void __thiscall Environment::set(Environment *this,string *variable,ResultValue value)

{
  bool bVar1;
  reference ppVar2;
  Variables *this_00;
  mapped_type *__dest;
  EnvironmentScope *scope;
  pair<const_ResultValueType,_EnvironmentScope> *current;
  iterator __end1;
  iterator __begin1;
  unordered_map<ResultValueType,_EnvironmentScope,_std::hash<ResultValueType>,_std::equal_to<ResultValueType>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>_>
  *__range1;
  string *variable_local;
  Environment *this_local;
  
  __end1 = std::
           unordered_map<ResultValueType,_EnvironmentScope,_std::hash<ResultValueType>,_std::equal_to<ResultValueType>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>_>
           ::begin(&this->mScopes);
  current = (pair<const_ResultValueType,_EnvironmentScope> *)
            std::
            unordered_map<ResultValueType,_EnvironmentScope,_std::hash<ResultValueType>,_std::equal_to<ResultValueType>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>_>
            ::end(&this->mScopes);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_ResultValueType,_EnvironmentScope>,_true>
                       ,(_Node_iterator_base<std::pair<const_ResultValueType,_EnvironmentScope>,_true>
                         *)&current);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_ResultValueType,_EnvironmentScope>,_false,_true>::
             operator*(&__end1);
    this_00 = EnvironmentScope::variables_abi_cxx11_(&ppVar2->second);
    __dest = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>_>
             ::operator[](this_00,variable);
    memcpy(__dest,&value,0x28);
    std::__detail::_Node_iterator<std::pair<const_ResultValueType,_EnvironmentScope>,_false,_true>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void Environment::set(std::string variable, ResultValue value) {
	for (auto& current : mScopes) {
		auto& scope = current.second;
		scope.variables()[variable] = value;
	}
}